

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

int Gia_ManFindEqualFlop(Vec_Ptr_t *vFlops,int iFlop,int nFlopWords)

{
  void **ppvVar1;
  void *__s2;
  int iVar2;
  ulong uVar3;
  
  if ((-1 < iFlop) && (iFlop < vFlops->nSize)) {
    if (iFlop != 0) {
      ppvVar1 = vFlops->pArray;
      __s2 = ppvVar1[(uint)iFlop];
      uVar3 = 0;
      do {
        iVar2 = bcmp(ppvVar1[uVar3],__s2,(long)nFlopWords << 2);
        if (iVar2 == 0) {
          return (int)uVar3;
        }
        uVar3 = uVar3 + 1;
      } while ((uint)iFlop != uVar3);
    }
    return -1;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Gia_ManFindEqualFlop( Vec_Ptr_t * vFlops, int iFlop, int nFlopWords )
{
    unsigned * pFlop, * pTemp;
    int i;
    pFlop = (unsigned *)Vec_PtrEntry( vFlops, iFlop );
    Vec_PtrForEachEntryStop( unsigned *, vFlops, pTemp, i, iFlop )
        if ( !memcmp( pTemp, pFlop, sizeof(unsigned) * nFlopWords ) )
            return i;
    return -1;
}